

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.cpp
# Opt level: O0

void __thiscall CInput::StopTextInput(CInput *this)

{
  long in_RDI;
  
  SDL_StopTextInput();
  SDL_EventState(0x201,0);
  *(undefined4 *)(in_RDI + 0x1284) = 0xffffffff;
  *(undefined4 *)(in_RDI + 0x127c) = 0;
  *(undefined1 *)(in_RDI + 0x1259) = 0;
  *(undefined4 *)(in_RDI + 0x1280) = 0;
  *(undefined4 *)(in_RDI + 0x1698) = 0;
  return;
}

Assistant:

void CInput::StopTextInput()
{
	SDL_StopTextInput();
	// disable system messages for performance
	SDL_EventState(SDL_SYSWMEVENT, SDL_DISABLE);
	m_CompositionLength = COMP_LENGTH_INACTIVE;
	m_CompositionCursor = 0;
	m_aComposition[0] = 0;
	m_CompositionSelectedLength = 0;
	m_CandidateCount = 0;
}